

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O2

void __thiscall sglr::GLContext::~GLContext(GLContext *this)

{
  ShaderProgram *this_00;
  CallLogWrapper *this_01;
  int iVar1;
  undefined4 extraout_var;
  _Base_ptr p_Var3;
  _Self __tmp;
  pointer ppSVar4;
  deUint32 fbo;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *local_38;
  long lVar2;
  
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__GLContext_00a30e70;
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  for (p_Var3 = (this->m_allocatedFbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_allocatedFbos)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    fbo = p_Var3[1]._M_color;
    (**(code **)(lVar2 + 0x440))(1,&fbo);
  }
  for (p_Var3 = (this->m_allocatedRbos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_allocatedRbos)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    fbo = p_Var3[1]._M_color;
    (**(code **)(lVar2 + 0x460))(1,&fbo);
  }
  for (p_Var3 = (this->m_allocatedTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_allocatedTextures)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    fbo = p_Var3[1]._M_color;
    (**(code **)(lVar2 + 0x480))(1,&fbo);
  }
  for (p_Var3 = (this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_allocatedBuffers)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    fbo = p_Var3[1]._M_color;
    (**(code **)(lVar2 + 0x438))(1,&fbo);
  }
  for (p_Var3 = (this->m_allocatedVaos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_allocatedVaos)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    fbo = p_Var3[1]._M_color;
    (**(code **)(lVar2 + 0x490))(1,&fbo);
  }
  for (ppSVar4 = (this->m_programs).
                 super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppSVar4 !=
      (this->m_programs).
      super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar4 = ppSVar4 + 1) {
    this_00 = *ppSVar4;
    if (this_00 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(this_00);
    }
    operator_delete(this_00,0xd0);
  }
  (**(code **)(lVar2 + 0x1680))(0);
  this_01 = this->m_wrapper;
  if (this_01 != (CallLogWrapper *)0x0) {
    glu::CallLogWrapper::~CallLogWrapper(this_01);
  }
  local_38 = &this->m_allocatedTextures;
  operator_delete(this_01,0x18);
  std::_Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::~_Vector_base
            (&(this->m_programs).
              super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->m_allocatedVaos)._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->m_allocatedBuffers)._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->m_allocatedRbos)._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&(this->m_allocatedFbos)._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_38->_M_t);
  return;
}

Assistant:

GLContext::~GLContext (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	// Clean up all still alive objects
	for (std::set<deUint32>::const_iterator i = m_allocatedFbos.begin();
		 i != m_allocatedFbos.end(); i++)
	{
		deUint32 fbo = *i;
		gl.deleteFramebuffers(1, &fbo);
	}

	for (std::set<deUint32>::const_iterator i = m_allocatedRbos.begin();
		 i != m_allocatedRbos.end(); i++)
	{
		deUint32 rbo = *i;
		gl.deleteRenderbuffers(1, &rbo);
	}

	for (std::set<deUint32>::const_iterator i = m_allocatedTextures.begin();
		 i != m_allocatedTextures.end(); i++)
	{
		deUint32 tex = *i;
		gl.deleteTextures(1, &tex);
	}

	for (std::set<deUint32>::const_iterator i = m_allocatedBuffers.begin();
		 i != m_allocatedBuffers.end(); i++)
	{
		deUint32 buf = *i;
		gl.deleteBuffers(1, &buf);
	}

	for (std::set<deUint32>::const_iterator i = m_allocatedVaos.begin();
		 i != m_allocatedVaos.end(); i++)
	{
		deUint32 vao = *i;
		gl.deleteVertexArrays(1, &vao);
	}

	for (std::vector<glu::ShaderProgram*>::iterator i = m_programs.begin();
		i != m_programs.end(); i++)
	{
		delete *i;
	}

	gl.useProgram(0);

	delete m_wrapper;
}